

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void addDataTypeNode(UA_Server *server,char *name,UA_UInt32 datatypeid,UA_Boolean isAbstract,
                    UA_UInt32 parent)

{
  UA_Node *node;
  UA_AddNodesResult res;
  UA_NodeId local_50;
  UA_Server *local_38;
  
  local_38 = server;
  node = UA_NodeStore_newNode(UA_NODECLASS_DATATYPE);
  copyNames(node,name);
  (node->nodeId).identifier.numeric = datatypeid;
  *(UA_Boolean *)&node[1].nodeId.namespaceIndex = isAbstract;
  local_50.namespaceIndex = 0;
  local_50.identifierType = UA_NODEIDTYPE_NUMERIC;
  res.statusCode = 0;
  res._4_4_ = 0;
  res.addedNodeId.namespaceIndex = 0;
  res.addedNodeId._2_2_ = 0;
  res.addedNodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  res.addedNodeId.identifier.string.length = 0;
  local_50.identifier.numeric = parent;
  Service_AddNodes_existing
            (local_38,&adminSession,node,&local_50,&nodeIdHasSubType,&UA_NODEID_NULL,
             (UA_InstantiationCallback *)0x0,(UA_NodeId *)&res);
  return;
}

Assistant:

static void
addDataTypeNode(UA_Server *server, char* name, UA_UInt32 datatypeid,
                UA_Boolean isAbstract, UA_UInt32 parent) {
    UA_DataTypeNode *datatype = UA_NodeStore_newDataTypeNode();
    copyNames((UA_Node*)datatype, name);
    datatype->nodeId.identifier.numeric = datatypeid;
    datatype->isAbstract = isAbstract;
    addNodeInternal(server, (UA_Node*)datatype,
                    UA_NODEID_NUMERIC(0, parent), nodeIdHasSubType);
}